

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O3

void (anonymous_namespace)::visit<Imath_3_2::Vec3<short>>
               (int *level,int n,int k,vector<int,_std::allocator<int>_> *value,
               vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> *perms)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  value_type local_36;
  
  iVar1 = *level;
  *level = iVar1 + 1;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[k]
       = iVar1 + 1;
  if (*level == n) {
    piVar2 = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar3 = (long)(value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar2;
    if (lVar3 != 0) {
      uVar4 = 0;
      do {
        (&local_36.x)[(int)uVar4] = (short)piVar2[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uVar4 & 0xffffffff) < (ulong)(lVar3 >> 2));
    }
    std::vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::push_back
              (perms,&local_36);
  }
  else if (0 < n) {
    uVar4 = 0;
    do {
      if ((value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar4] == 0) {
        visit<Imath_3_2::Vec3<short>>(level,n,(int)uVar4,value,perms);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)n != uVar4);
  }
  *level = *level + -1;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[k]
       = 0;
  return;
}

Assistant:

static void
visit (int& level, int n, int k, std::vector<int>& value, std::vector<T>& perms)
{
    level    = level + 1;
    value[k] = level;

    if (level == n)
        addItem (value, perms);
    else
        for (int i = 0; i < n; i++)
            if (value[i] == 0) visit (level, n, i, value, perms);

    level    = level - 1;
    value[k] = 0;
}